

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O1

void __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setContactsNumber
          (ModelBaseEKFFlexEstimatorIMU *this,uint i)

{
  ExtendedKalmanFilter *this_00;
  IMUElasticLocalFrameDynamicalSystem *this_01;
  uint uVar1;
  
  this_01 = &this->functor_;
  IMUElasticLocalFrameDynamicalSystem::setContactsNumber(this_01,i);
  uVar1 = IMUElasticLocalFrameDynamicalSystem::getInputSize(this_01);
  this->inputSize_ = uVar1;
  this_00 = &(this->super_EKFFlexibilityEstimatorBase).ekf_;
  ZeroDelayObserver::setInputSize((ZeroDelayObserver *)this_00,uVar1);
  if (this->useFTSensors_ == true) {
    uVar1 = IMUElasticLocalFrameDynamicalSystem::getMeasurementSize(this_01);
    KalmanFilterBase::setMeasureSize(&this_00->super_KalmanFilterBase,uVar1);
    (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
      _vptr_FlexibilityEstimatorBase[0x44])(this);
    return;
  }
  return;
}

Assistant:

void ModelBaseEKFFlexEstimatorIMU::setContactsNumber(unsigned i)
    {
        functor_.setContactsNumber(i);

        inputSize_ = functor_.getInputSize();
        ekf_.setInputSize(inputSize_);

        if (useFTSensors_)
        {
          ekf_.setMeasureSize(functor_.getMeasurementSize());
          updateMeasurementCovarianceMatrix_();
        }
    }